

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall MultiObjTestSolver<2>::~MultiObjTestSolver(MultiObjTestSolver<2> *this)

{
  pointer pSVar1;
  
  (this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
  super_ErrorHandler._vptr_ErrorHandler = (_func_int **)&PTR__Solver_0028adb8;
  (this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
  super_OutputHandler._vptr_OutputHandler = (_func_int **)&PTR__Solver_0028ae28;
  (this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
  super_Interrupter._vptr_Interrupter = (_func_int **)&PTR__Solver_0028ae50;
  (this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
  super_SolverOptionManager._vptr_SolverOptionManager = (_func_int **)&PTR__Solver_0028ae80;
  (this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.super_BasicSolver.
  super_SolveResultRegistry._vptr_SolveResultRegistry = (_func_int **)&PTR__Solver_0028aea0;
  pSVar1 = (this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.suffixes_.
           super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->super_SolverImpl<MultiObjMockProblemBuilder>).super_Solver.
                                 suffixes_.
                                 super__Vector_base<mp::Solver::SuffixInfo,_std::allocator<mp::Solver::SuffixInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  mp::BasicSolver::~BasicSolver((BasicSolver *)this);
  operator_delete(this,0x308);
  return;
}

Assistant:

explicit MultiObjTestSolver()
    : mp::SolverImpl<MultiObjMockProblemBuilder>("", 0, 0, FLAGS), builder(0) {}